

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O3

TBoard * makeBoard(TBoard *__return_storage_ptr__,short k)

{
  undefined1 auVar1 [12];
  unkbyte10 Var2;
  short sVar3;
  int iVar4;
  int iVar5;
  undefined6 in_register_00000032;
  short sVar6;
  uint uVar7;
  short sVar8;
  undefined1 auVar9 [16];
  
  iVar5 = (int)CONCAT62(in_register_00000032,k);
  sVar3 = (short)((uint)(iVar5 * 0x5556) >> 0x10);
  sVar3 = sVar3 - (sVar3 >> 0xf);
  sVar6 = (short)((uint)(iVar5 * 0x1c72) >> 0x10);
  sVar6 = sVar6 - (sVar6 >> 0xf);
  uVar7 = ((uint)(iVar5 * -0x684b) >> 0x10) + iVar5;
  auVar9._2_2_ = sVar3;
  auVar9._0_2_ = k;
  auVar9._4_2_ = sVar6;
  sVar8 = (short)((uint)(int)(short)uVar7 >> 4) + (short)((uVar7 & 0xffff) >> 0xf);
  auVar9._6_2_ = sVar8;
  auVar9._8_8_ = 0;
  auVar9 = pmulhw(_DAT_00154530,auVar9);
  sVar3 = sVar3 + (auVar9._2_2_ - (auVar9._2_2_ >> 0xf)) * -3;
  sVar6 = sVar6 + (auVar9._4_2_ - (auVar9._4_2_ >> 0xf)) * -3;
  sVar8 = sVar8 + (auVar9._6_2_ - (auVar9._6_2_ >> 0xf)) * -3;
  Var2 = CONCAT64(CONCAT42(CONCAT22(sVar8,sVar8),sVar6),CONCAT22(sVar6,sVar8));
  auVar1._4_8_ = (long)((unkuint10)Var2 >> 0x10);
  auVar1._2_2_ = sVar3;
  auVar1._0_2_ = sVar3;
  __return_storage_ptr__->_M_elems[0]._M_elems[0] =
       (int)(short)(k + (auVar9._0_2_ - (auVar9._0_2_ >> 0xf)) * -3);
  __return_storage_ptr__->_M_elems[0]._M_elems[1] = auVar1._0_4_ >> 0x10;
  __return_storage_ptr__->_M_elems[0]._M_elems[2] = (int)((unkuint10)Var2 >> 0x10) >> 0x10;
  __return_storage_ptr__->_M_elems[1]._M_elems[0] = (int)sVar8;
  iVar4 = (iVar5 * 0x6523 >> 0x15) - (iVar5 * 0x6523 >> 0x1f);
  sVar3 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
  __return_storage_ptr__->_M_elems[1]._M_elems[1] =
       (int)(short)((short)iVar4 + (sVar3 - (sVar3 >> 0xf)) * -3);
  iVar4 = (iVar5 * 0x436d >> 0x16) - (iVar5 * 0x436d >> 0x1f);
  sVar3 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
  __return_storage_ptr__->_M_elems[1]._M_elems[2] =
       (int)(short)((short)iVar4 + (sVar3 - (sVar3 >> 0xf)) * -3);
  uVar7 = ((uint)(iVar5 * -0x4c33) >> 0x10) + iVar5;
  iVar4 = ((int)(short)uVar7 >> 9) + ((uVar7 & 0xffff) >> 0xf);
  uVar7 = iVar4 * 0x56;
  __return_storage_ptr__->_M_elems[2]._M_elems[0] =
       (int)(char)((char)iVar4 + ((char)((uVar7 & 0xffff) >> 0xf) + (char)(uVar7 >> 8)) * -3);
  iVar4 = (iVar5 * 0x3bef >> 0x19) - (iVar5 * 0x3bef >> 0x1f);
  uVar7 = iVar4 * 0x56;
  __return_storage_ptr__->_M_elems[2]._M_elems[1] =
       (int)(char)((char)iVar4 + ((char)((uVar7 & 0xffff) >> 0xf) + (char)(uVar7 >> 8)) * -3);
  iVar4 = (iVar5 * 0x4fe9 >> 0x1b) - (iVar5 * 0x4fe9 >> 0x1f);
  uVar7 = iVar4 * 0x56;
  __return_storage_ptr__->_M_elems[2]._M_elems[2] =
       (int)(char)((char)iVar4 + ((char)((uVar7 & 0xffff) >> 0xf) + (char)(uVar7 >> 8)) * -3);
  return __return_storage_ptr__;
}

Assistant:

TBoard
makeBoard(short k)
{
    return {{{{k / g_factors[0] % 3, k / g_factors[1] % 3, k / g_factors[2] % 3}},
             {{k / g_factors[3] % 3, k / g_factors[4] % 3, k / g_factors[5] % 3}},
             {{k / g_factors[6] % 3, k / g_factors[7] % 3, k / g_factors[8] % 3}}}};
}